

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Sprs_array_row_distribution64(int s_a,int iproc,int64_t *lo,int64_t *hi)

{
  Integer *in_RCX;
  Integer *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  Integer ihi;
  Integer ilo;
  Integer ip;
  Integer sa;
  undefined8 local_38;
  undefined8 local_30;
  
  pnga_sprs_array_row_distribution(ihi,CONCAT44(in_EDI,in_ESI),in_RDX,in_RCX);
  *in_RDX = local_30;
  *in_RCX = local_38;
  return;
}

Assistant:

void NGA_Sprs_array_row_distribution64(int s_a, int iproc, int64_t *lo, int64_t *hi)
{
  Integer sa = (Integer)s_a;
  Integer ip = (Integer)iproc;
  Integer ilo, ihi;
  wnga_sprs_array_row_distribution(sa,ip,&ilo,&ihi);
  *lo = (int64_t)ilo;
  *hi = (int64_t)ihi;
}